

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_unix.c
# Opt level: O3

_Bool authunix_refresh(AUTH *auth,void *dummy)

{
  char *pcVar1;
  int iVar2;
  bool_t bVar3;
  _Bool _Var4;
  timespec now;
  XDR xdrs;
  undefined1 local_c8 [48];
  XDR local_98;
  
  if (auth != (AUTH *)0x0) {
    iVar2 = bcmp(&auth->ah_cred,auth + 1,0x198);
    if (iVar2 == 0) {
      _Var4 = false;
    }
    else {
      pcVar1 = auth[2].ah_cred.oa_body + 0x13c;
      *(long *)pcVar1 = *(long *)pcVar1 + 1;
      local_c8._0_8_ = 0;
      local_c8._8_8_ = (char *)0x0;
      xdrmem_ncreate(&local_98,auth[1].ah_key.c,*(u_int *)((long)&auth[1].ah_ops + 4),XDR_DECODE);
      bVar3 = xdr_authunix_parms((XDR *)&local_98,(authunix_parms *)local_c8);
      if ((char)bVar3 == '\0') {
        _Var4 = false;
      }
      else {
        clock_gettime(6,(timespec *)(local_c8 + 0x20));
        local_c8._28_4_ = local_c8._32_4_;
        local_98.x_op = XDR_ENCODE;
        _Var4 = false;
        (*(local_98.x_ops)->x_setpostn)(&local_98,0);
        bVar3 = xdr_authunix_parms((XDR *)&local_98,(authunix_parms *)local_c8);
        if ((char)bVar3 != '\0') {
          memcpy(&auth->ah_cred,auth + 1,0x198);
          marshal_new_auth(auth);
          _Var4 = true;
        }
      }
      local_98.x_op = XDR_FREE;
      xdr_authunix_parms((XDR *)&local_98,(authunix_parms *)local_c8);
      if ((local_98.x_ops)->x_destroy != (_func_void_rpc_xdr_ptr *)0x0) {
        (*(local_98.x_ops)->x_destroy)(&local_98);
      }
    }
    return _Var4;
  }
  __assert_fail("auth != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/auth_unix.c"
                ,0x10c,"_Bool authunix_refresh(AUTH *, void *)");
}

Assistant:

static bool
authunix_refresh(AUTH *auth, void *dummy)
{
	struct audata *au = AUTH_PRIVATE(auth);
	struct authunix_parms aup;
	struct timespec now;
	XDR xdrs;
	int stat;

	assert(auth != NULL);

	if (memcmp(&auth->ah_cred, &au->au_origcred, sizeof(struct opaque_auth))
	    == 0) {
		/* there is no hope.  Punt */
		return (false);
	}
	au->au_shfaults++;

	/* first deserialize the creds back into a struct authunix_parms */
	aup.aup_machname = NULL;
	aup.aup_gids = NULL;
	xdrmem_create(&xdrs, au->au_origcred.oa_body, au->au_origcred.oa_length,
		      XDR_DECODE);
	stat = xdr_authunix_parms(&xdrs, &aup);
	if (!stat)
		goto done;

	/* update the time and serialize in place */
	(void)clock_gettime(CLOCK_MONOTONIC_FAST, &now);
	aup.aup_time = now.tv_sec;
	xdrs.x_op = XDR_ENCODE;
	XDR_SETPOS(&xdrs, 0);
	stat = xdr_authunix_parms(&xdrs, &aup);
	if (!stat)
		goto done;
	auth->ah_cred = au->au_origcred;
	marshal_new_auth(auth);
 done:
	/* free the struct authunix_parms created by deserializing */
	xdrs.x_op = XDR_FREE;
	(void)xdr_authunix_parms(&xdrs, &aup);
	XDR_DESTROY(&xdrs);
	return (stat);
}